

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QCss::Pseudo>::relocate
          (QArrayDataPointer<QCss::Pseudo> *this,qsizetype offset,Pseudo **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QCss::Pseudo> *in_RDI;
  Pseudo **unaff_retaddr;
  Pseudo *res;
  Pseudo *first;
  QArrayDataPointer<QCss::Pseudo> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QCss::Pseudo,long_long>(first,(longlong)in_RDI,(Pseudo *)0xa5b337)
  ;
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QCss::Pseudo>,QCss::Pseudo_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x40 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }